

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O3

vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
* get_1d_sincos_pos_embed_from_grid_new
            (vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
             *__return_storage_ptr__,int embed_dim,
            vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            *pos)

{
  pointer pvVar1;
  pointer pfVar2;
  long lVar3;
  vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
  *pvVar4;
  vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
  *extraout_RAX;
  vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
  *extraout_RAX_00;
  vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
  *pvVar5;
  vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
  *extraout_RAX_01;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  float fVar10;
  float fVar11;
  double dVar12;
  vector<float,_std::allocator<float>_> omega;
  allocator_type local_bf;
  allocator_type local_be;
  allocator_type local_bd;
  uint local_bc;
  ulong local_b8;
  ulong local_b0;
  pointer local_a8;
  ulong local_a0;
  ulong local_98;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *local_90;
  vector<float,_std::allocator<float>_> local_88;
  ulong local_70;
  vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
  *local_68;
  vector<float,_std::allocator<float>_> local_60;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_48;
  
  pvVar1 = (pos->
           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_a8 = (pos->
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  pfVar2 = *(pointer *)
            ((long)&(pvVar1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                    super__Vector_impl_data + 8);
  lVar3 = *(long *)&(pvVar1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                    super__Vector_impl_data;
  uVar8 = (ulong)((uint)embed_dim >> 1);
  std::vector<float,_std::allocator<float>_>::vector(&local_88,uVar8,(allocator_type *)&local_48);
  local_bc = embed_dim;
  if (1 < (uint)embed_dim) {
    uVar6 = 0;
    do {
      dVar12 = pow(10000.0,(double)((float)(int)uVar6 / (float)((uint)embed_dim >> 1)));
      local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar6] = (float)(1.0 / dVar12);
      uVar6 = uVar6 + 1;
    } while (uVar8 != uVar6);
  }
  std::vector<float,_std::allocator<float>_>::vector(&local_60,(ulong)local_bc,&local_bd);
  local_a0 = (ulong)((long)pfVar2 - lVar3) >> 2;
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector(&local_48,(long)(int)local_a0,&local_60,&local_be);
  local_b8 = ((long)local_a8 - (long)pvVar1 >> 3) * -0x5555555555555555;
  std::
  vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
  ::vector(__return_storage_ptr__,(long)(int)local_b8,&local_48,&local_bf);
  local_98 = uVar8;
  local_90 = pos;
  local_68 = __return_storage_ptr__;
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&local_48);
  pvVar5 = extraout_RAX;
  if (local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
    pvVar5 = extraout_RAX_00;
  }
  pvVar4 = local_68;
  if (0 < (int)local_b8) {
    pvVar5 = (vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
              *)0x7fffffff;
    local_b8 = local_b8 & 0x7fffffff;
    local_70 = local_a0 & 0x7fffffff;
    uVar8 = local_98 * 4;
    local_b0 = 0;
    local_98 = uVar8;
    do {
      uVar6 = local_b0;
      if (0 < (int)local_a0) {
        pvVar5 = (vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                  *)(local_b0 * 8);
        uVar9 = 0;
        do {
          if (1 < local_bc) {
            local_a8 = (pointer)(uVar9 * 0x18);
            uVar7 = 0;
            do {
              fVar10 = *(float *)(*(long *)&(local_90->
                                            super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start[uVar6].
                                            super__Vector_base<float,_std::allocator<float>_>.
                                            _M_impl.super__Vector_impl_data + uVar9 * 4) *
                       *(float *)((long)local_88.super__Vector_base<float,_std::allocator<float>_>.
                                        _M_impl.super__Vector_impl_data._M_start + uVar7);
              fVar11 = sinf(fVar10);
              pvVar1 = local_a8;
              *(float *)(*(long *)((long)&(local_a8->
                                          super__Vector_base<float,_std::allocator<float>_>)._M_impl
                                          .super__Vector_impl_data._M_start +
                                  *(long *)&(pvVar4->
                                            super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start[uVar6].
                                            super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                            ._M_impl.super__Vector_impl_data) + uVar7) = fVar11;
              fVar10 = cosf(fVar10);
              pvVar5 = (vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                        *)(*(long *)((long)&(pvVar1->
                                            super__Vector_base<float,_std::allocator<float>_>).
                                            _M_impl.super__Vector_impl_data._M_start +
                                    *(long *)&(pvVar4->
                                              super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start[uVar6].
                                              super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                              ._M_impl.super__Vector_impl_data) + uVar8);
              *(float *)((long)&(pvVar5->
                                super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar7) = fVar10;
              uVar7 = uVar7 + 4;
            } while (uVar8 != uVar7);
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 != local_70);
      }
      local_b0 = local_b0 + 1;
    } while (local_b0 != local_b8);
  }
  if (local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
    pvVar5 = extraout_RAX_01;
  }
  return pvVar5;
}

Assistant:

static std::vector<std::vector<std::vector<float>>> get_1d_sincos_pos_embed_from_grid_new(int embed_dim, const std::vector<std::vector<float>> & pos) {
    assert(embed_dim % 2 == 0);
    int H = pos.size();
    int W = pos[0].size();

    std::vector<float> omega(embed_dim / 2);
    for (int i = 0; i < embed_dim / 2; ++i) {
        omega[i] = 1.0 / pow(10000.0, static_cast<float>(i) / (embed_dim / 2));
    }

    std::vector<std::vector<std::vector<float>>> emb(H, std::vector<std::vector<float>>(W, std::vector<float>(embed_dim)));
    for (int h = 0; h < H; ++h) {
        for (int w = 0; w < W; ++w) {
            for (int d = 0; d < embed_dim / 2; ++d) {
                float out_value = pos[h][w] * omega[d];
                emb[h][w][d] = sin(out_value);
                emb[h][w][d + embed_dim / 2] = cos(out_value);
            }
        }
    }

    return emb;
}